

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O3

int onig_unicode_define_user_property(char *name,OnigCodePoint *ranges)

{
  byte bVar1;
  st_table *table;
  int iVar2;
  size_t sVar3;
  OnigUChar *str_key;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  
  iVar7 = UserDefinedPropertyNum;
  iVar2 = -0x194;
  if (UserDefinedPropertyNum < 0x14) {
    sVar3 = strlen(name);
    iVar2 = -0x195;
    uVar6 = (uint)sVar3;
    if ((int)uVar6 < 0x3d) {
      str_key = (OnigUChar *)malloc((long)(int)(uVar6 + 1));
      iVar2 = -5;
      if (str_key != (OnigUChar *)0x0) {
        uVar5 = 0;
        if (0 < (int)uVar6) {
          uVar4 = 0;
          do {
            bVar1 = name[uVar4];
            if ((char)bVar1 < ' ') {
              free(str_key);
              return -0xdf;
            }
            if ((0x3f < bVar1 - 0x20) ||
               ((0x8000000000002001U >> ((ulong)(bVar1 - 0x20) & 0x3f) & 1) == 0)) {
              str_key[(int)uVar5] = bVar1;
              uVar5 = (ulong)((int)uVar5 + 1);
            }
            uVar4 = uVar4 + 1;
          } while ((uVar6 & 0x7fffffff) != uVar4);
          uVar5 = (ulong)(int)uVar5;
        }
        str_key[uVar5] = '\0';
        if ((UserDefinedPropertyTable == (st_table *)0x0) &&
           (UserDefinedPropertyTable = (st_table *)onig_st_init_strend_table_with_size(10),
           iVar7 = UserDefinedPropertyNum, UserDefinedPropertyTable == (st_table *)0x0)) {
          free(str_key);
        }
        else {
          table = UserDefinedPropertyTable;
          UserDefinedPropertyRanges[iVar7].ctype = iVar7 + 0x275;
          UserDefinedPropertyRanges[iVar7].ranges = ranges;
          iVar2 = onig_st_insert_strend
                            (table,str_key,str_key + uVar5,
                             (hash_data_type)(UserDefinedPropertyRanges + iVar7));
          if (-1 < iVar2) {
            UserDefinedPropertyNum = UserDefinedPropertyNum + 1;
            iVar2 = 0;
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

extern int
onig_unicode_define_user_property(const char* name, OnigCodePoint* ranges)
{
  UserDefinedPropertyValue* e;
  int r;
  int i;
  int n;
  int len;
  int c;
  char* s;
  UChar* uname;

  if (UserDefinedPropertyNum >= USER_DEFINED_PROPERTY_MAX_NUM)
    return ONIGERR_TOO_MANY_USER_DEFINED_OBJECTS;

  len = (int )strlen(name);
  if (len >= PROPERTY_NAME_MAX_SIZE)
    return ONIGERR_TOO_LONG_PROPERTY_NAME;

  s = (char* )xmalloc(len + 1);
  if (s == 0)
    return ONIGERR_MEMORY;

  uname = (UChar* )name;
  n = 0;
  for (i = 0; i < len; i++) {
    c = uname[i];
    if (c < 0x20 || c >= 0x80) {
      xfree(s);
      return ONIGERR_INVALID_CHAR_PROPERTY_NAME;
    }

    if (c != ' ' && c != '-' && c != '_') {
      s[n] = c;
      n++;
    }
  }
  s[n] = '\0';

  if (UserDefinedPropertyTable == 0) {
    UserDefinedPropertyTable = onig_st_init_strend_table_with_size(10);
    if (IS_NULL(UserDefinedPropertyTable)) {
      xfree(s);
      return ONIGERR_MEMORY;
    }
  }

  e = UserDefinedPropertyRanges + UserDefinedPropertyNum;
  e->ctype = CODE_RANGES_NUM + UserDefinedPropertyNum;
  e->ranges = ranges;
  r = onig_st_insert_strend(UserDefinedPropertyTable,
                            (const UChar* )s, (const UChar* )s + n,
                            (hash_data_type )((void* )e));
  if (r < 0) return r;

  UserDefinedPropertyNum++;
  return 0;
}